

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiwrapper.cxx
# Opt level: O2

int MPIABI_Get_library_version(char *version,int *resultlen)

{
  int iVar1;
  int wrapped_resultlen;
  char wrapped_version [256];
  
  MPI_Get_library_version(wrapped_version,&wrapped_resultlen);
  iVar1 = snprintf(version,0x2000,"MPIwrapper %s, using MPIABI %d.%d.%d, wrapping:\n%s","2.11.1",2,
                   10,0,wrapped_version);
  *resultlen = iVar1;
  return 0;
}

Assistant:

int MPIABI_Get_library_version(char *version, int *resultlen) {
  char wrapped_version[MPI_MAX_LIBRARY_VERSION_STRING];
  int wrapped_resultlen;
  MPI_Get_library_version(wrapped_version, &wrapped_resultlen);

  // TODO: Add MPItrampoline version number as well
  *resultlen = std::snprintf(
      version, MPIABI_MAX_LIBRARY_VERSION_STRING,
      "MPIwrapper %s, using MPIABI %d.%d.%d, wrapping:\n%s", MPIWRAPPER_VERSION,
      MPIABI_VERSION_MAJOR, MPIABI_VERSION_MINOR, MPIABI_VERSION_PATCH,
      wrapped_version);
  return MPI_SUCCESS;
}